

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreeState::Finalize
          (WindowSegmentTreeState *this,WindowAggregatorGlobalState *gastate,
          CollectionPtr collection)

{
  __pthread_list_t *p_Var1;
  __atomic_base<unsigned_long> _Var2;
  WindowAggregator *pWVar3;
  value_type vVar4;
  pointer paVar5;
  __pthread_internal_list *p_Var6;
  optional_ptr<duckdb::WindowCollection,_true> paged;
  int iVar7;
  WindowCursor *this_00;
  ArenaAllocator *allocator;
  const_reference pvVar8;
  type pvVar9;
  int *piVar10;
  ulong end;
  ulong uVar11;
  mutex *this_01;
  __pthread_internal_list *__n;
  ulong uVar12;
  WindowSegmentTreePart gtstate;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> local_270;
  WindowCursor *local_268;
  mutex *local_260;
  optional_ptr<duckdb::WindowCollection,_true> local_258;
  atomic<unsigned_long> *local_250;
  __pthread_internal_list **local_248;
  ulong local_240;
  timespec local_238;
  WindowSegmentTreePart local_228;
  
  local_258.ptr = collection.ptr;
  WindowAggregatorLocalState::Finalize(&this->super_WindowAggregatorLocalState,gastate,collection);
  optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&local_258);
  paged.ptr = local_258.ptr;
  pWVar3 = gastate->aggregator;
  this_00 = (WindowCursor *)operator_new(200);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
             &(pWVar3->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  WindowCursor::WindowCursor(this_00,paged.ptr,(vector<unsigned_long,_true> *)&local_228);
  local_268 = this_00;
  if (local_228.allocator != (ArenaAllocator *)0x0) {
    operator_delete(local_228.allocator);
  }
  optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&local_258);
  local_240 = (local_258.ptr)->count;
  allocator = WindowSegmentTreeGlobalState::CreateTreeAllocator
                        ((WindowSegmentTreeGlobalState *)gastate);
  local_270._M_head_impl = local_268;
  local_268 = (WindowCursor *)0x0;
  WindowSegmentTreePart::WindowSegmentTreePart
            (&local_228,allocator,&gastate->aggr,
             (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             &local_270,&gastate->filter_mask);
  if (local_270._M_head_impl != (WindowCursor *)0x0) {
    ::std::default_delete<duckdb::WindowCursor>::operator()
              ((default_delete<duckdb::WindowCursor> *)&local_270,local_270._M_head_impl);
  }
  local_270._M_head_impl = (WindowCursor *)0x0;
  __n = gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__prev;
  if (__n < (__pthread_internal_list *)
            (*(long *)((long)&gastate[1].lock.super___mutex_base._M_mutex + 8) -
             gastate[1].lock.super___mutex_base._M_mutex.__align >> 3)) {
    this_01 = &gastate[1].lock;
    local_248 = &gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__next;
    local_250 = &gastate[1].locals;
    local_260 = this_01;
    do {
      uVar12 = local_240;
      if (__n != (__pthread_internal_list *)0x0) {
        pvVar8 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)this_01,(size_type)__n);
        vVar4 = *pvVar8;
        pvVar8 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)this_01,
                            (size_type)((long)&__n[-1].__next + 7));
        uVar12 = vVar4 - *pvVar8;
      }
      if (uVar12 < 2) break;
      pvVar9 = unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
               ::operator*((unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
                            *)local_248);
      this_01 = local_260;
      paVar5 = (pvVar9->
               super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
               ).
               super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((__pthread_internal_list *)
          ((long)(pvVar9->
                 super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                 ).
                 super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) <= __n) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__n);
      }
      uVar11 = uVar12 + 0xf >> 4;
      LOCK();
      paVar5 = paVar5 + (long)__n;
      _Var2._M_i = (paVar5->super___atomic_base<unsigned_long>)._M_i;
      (paVar5->super___atomic_base<unsigned_long>)._M_i =
           (paVar5->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if (_Var2._M_i < uVar11) {
        pvVar8 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)local_260,(size_type)__n);
        end = _Var2._M_i * 0x10 + 0x10;
        if (uVar12 < end) {
          end = uVar12;
        }
        WindowSegmentTreePart::WindowSegmentValue
                  (&local_228,(WindowSegmentTreeGlobalState *)gastate,(idx_t)__n,_Var2._M_i * 0x10,
                   end,(data_ptr_t)
                       ((long)&((gastate[1].aggr.filter)->super_BaseExpression)._vptr_BaseExpression
                       + (_Var2._M_i + *pvVar8) * (long)gastate[1].aggr.function.serialize));
        WindowSegmentTreePart::FlushStates(&local_228,__n != (__pthread_internal_list *)0x0);
        pvVar9 = unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
                 ::operator*((unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
                              *)local_250);
        paVar5 = (pvVar9->
                 super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                 ).
                 super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((__pthread_internal_list *)
            ((long)(pvVar9->
                   super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                   ).
                   super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) <= __n) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__n
                    );
        }
        LOCK();
        paVar5 = paVar5 + (long)__n;
        _Var2._M_i = (paVar5->super___atomic_base<unsigned_long>)._M_i;
        (paVar5->super___atomic_base<unsigned_long>)._M_i =
             (paVar5->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        this_01 = local_260;
        if (_Var2._M_i + 1 == uVar11) {
          LOCK();
          p_Var1 = &gastate[1].lock.super___mutex_base._M_mutex.__data.__list;
          p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + 1);
          UNLOCK();
        }
      }
      else {
        p_Var6 = gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__prev;
        while (__n == p_Var6) {
          local_238.tv_sec = 0;
          local_238.tv_nsec = 1000000;
          do {
            iVar7 = nanosleep(&local_238,&local_238);
            if (iVar7 != -1) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
          p_Var6 = gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__prev;
        }
      }
      __n = gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__prev;
    } while (__n < (__pthread_internal_list *)
                   (*(long *)((long)&gastate[1].lock.super___mutex_base._M_mutex + 8) -
                    gastate[1].lock.super___mutex_base._M_mutex.__align >> 3));
  }
  WindowSegmentTreePart::~WindowSegmentTreePart(&local_228);
  if (local_268 != (WindowCursor *)0x0) {
    ::std::default_delete<duckdb::WindowCursor>::operator()
              ((default_delete<duckdb::WindowCursor> *)&local_268,local_268);
  }
  return;
}

Assistant:

void WindowSegmentTreeState::Finalize(WindowAggregatorGlobalState &gastate, CollectionPtr collection) {
	WindowAggregatorLocalState::Finalize(gastate, collection);

	//	Single part for constructing the tree
	auto &gstate = gastate.Cast<WindowSegmentTreeGlobalState>();
	auto cursor = make_uniq<WindowCursor>(*collection, gastate.aggregator.child_idx);
	const auto leaf_count = collection->size();
	auto &filter_mask = gstate.filter_mask;
	WindowSegmentTreePart gtstate(gstate.CreateTreeAllocator(), gastate.aggr, std::move(cursor), filter_mask);

	auto &levels_flat_native = gstate.levels_flat_native;
	const auto &levels_flat_start = gstate.levels_flat_start;
	// iterate over the levels of the segment tree
	for (;;) {
		const idx_t level_current = gstate.build_level.load();
		if (level_current >= levels_flat_start.size()) {
			break;
		}

		// level 0 is data itself
		const auto level_size =
		    (level_current == 0 ? leaf_count : levels_flat_start[level_current] - levels_flat_start[level_current - 1]);
		if (level_size <= 1) {
			break;
		}
		const idx_t build_count = (level_size + gstate.TREE_FANOUT - 1) / gstate.TREE_FANOUT;

		// Build the next fan-in
		const idx_t build_idx = (*gstate.build_started).at(level_current)++;
		if (build_idx >= build_count) {
			//	Nothing left at this level, so wait until other threads are done.
			//	Since we are only building TREE_FANOUT values at a time, this will be quick.
			while (level_current == gstate.build_level.load()) {
				std::this_thread::sleep_for(std::chrono::milliseconds(1));
			}
			continue;
		}

		// compute the aggregate for this entry in the segment tree
		const idx_t pos = build_idx * gstate.TREE_FANOUT;
		const idx_t levels_flat_offset = levels_flat_start[level_current] + build_idx;
		auto state_ptr = levels_flat_native.GetStatePtr(levels_flat_offset);
		gtstate.WindowSegmentValue(gstate, level_current, pos, MinValue(level_size, pos + gstate.TREE_FANOUT),
		                           state_ptr);
		gtstate.FlushStates(level_current > 0);

		//	If that was the last one, mark the level as complete.
		const idx_t build_complete = ++(*gstate.build_completed).at(level_current);
		if (build_complete == build_count) {
			gstate.build_level++;
			continue;
		}
	}
}